

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::EnumDescriptorProto::IsInitialized(EnumDescriptorProto *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  EnumValueDescriptorProto *pEVar4;
  EnumOptions *pEVar5;
  int local_1c;
  int i;
  EnumDescriptorProto *this_local;
  
  for (local_1c = 0; iVar2 = value_size(this), local_1c < iVar2; local_1c = local_1c + 1) {
    pEVar4 = value(this,local_1c);
    uVar3 = (*(pEVar4->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((uVar3 & 1) == 0) {
      return false;
    }
  }
  bVar1 = has_options(this);
  if (bVar1) {
    pEVar5 = options(this);
    uVar3 = (*(pEVar5->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((uVar3 & 1) == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool EnumDescriptorProto::IsInitialized() const {

  for (int i = 0; i < value_size(); i++) {
    if (!this->value(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}